

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_insert(lyd_node **first_sibling,lyd_node **leader,lyd_node *node)

{
  LY_ERR LVar1;
  lyd_value_lyds_tree *_lt;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_meta *root_meta;
  rb_node *rbn;
  rb_node *rbt;
  lyd_node *plStack_28;
  LY_ERR ret;
  lyd_node *node_local;
  lyd_node **leader_local;
  lyd_node **first_sibling_local;
  
  plStack_28 = node;
  node_local = (lyd_node *)leader;
  leader_local = first_sibling;
  if ((((node->prev == node) ||
       ((node->prev->schema != node->schema &&
        ((node->next == (lyd_node *)0x0 || (node->schema != node->next->schema)))))) &&
      (leader != (lyd_node **)0x0)) && (node != (lyd_node *)0x0)) {
    rbn = lyds_get_rb_tree(node,(lyd_meta **)&ret___1);
    if (_ret___1 != (lyd_meta *)0x0) {
      if ((rbn != (rb_node *)0x0) &&
         ((rbn->left != (rb_node *)0x0 || (rbn->right != (rb_node *)0x0)))) {
        __assert_fail("!rbt || (!RBN_LEFT(rbt) && !RBN_RIGHT(rbt))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                      ,0x4c9,
                      "LY_ERR lyds_insert(struct lyd_node **, struct lyd_node **, struct lyd_node *)"
                     );
      }
      lyd_free_meta_single(_ret___1);
    }
    rbn = lyds_get_rb_tree(*(lyd_node **)node_local,(lyd_meta **)&ret___1);
    if ((_ret___1 != (lyd_meta *)0x0) ||
       (first_sibling_local._4_4_ =
             lyds_create_metadata(*(lyd_node **)node_local,(lyd_meta **)&ret___1),
       first_sibling_local._4_4_ == LY_SUCCESS)) {
      if (rbn == (rb_node *)0x0) {
        LVar1 = lyds_additionally_create_rb_tree(leader_local,(lyd_node **)node_local,_ret___1,&rbn)
        ;
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        rbt._4_4_ = 0;
      }
      rbt._4_4_ = rb_insert(plStack_28,&rbn,(rb_node **)&root_meta);
      first_sibling_local._4_4_ = rbt._4_4_;
      if (rbt._4_4_ == LY_SUCCESS) {
        lyds_link_data_node(leader_local,(lyd_node **)node_local,plStack_28,_ret___1,
                            (rb_node *)root_meta);
        (_ret___1->value).field_2.enum_item = (lysc_type_bitenum_item *)rbn;
        first_sibling_local._4_4_ = LY_SUCCESS;
      }
    }
    return first_sibling_local._4_4_;
  }
  __assert_fail("LYD_NODE_IS_ALONE(node) && leader && node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x4c4,
                "LY_ERR lyds_insert(struct lyd_node **, struct lyd_node **, struct lyd_node *)");
}

Assistant:

LY_ERR
lyds_insert(struct lyd_node **first_sibling, struct lyd_node **leader, struct lyd_node *node)
{
    LY_ERR ret;
    struct rb_node *rbt, *rbn;
    struct lyd_meta *root_meta;

    /* @p node must not be part of another Red-black tree, only single node can satisfy this condition */
    assert(LYD_NODE_IS_ALONE(node) && leader && node);

    /* Clear the @p node. It may have unnecessary data due to duplication or due to lyds_unlink() calls. */
    rbt = lyds_get_rb_tree(node, &root_meta);
    if (root_meta) {
        assert(!rbt || (!RBN_LEFT(rbt) && !RBN_RIGHT(rbt)));
        /* metadata in @p node will certainly no longer be needed */
        lyd_free_meta_single(root_meta);
    }

    /* get the Red-black tree from the @p leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);
    if (!root_meta) {
        LY_CHECK_RET(lyds_create_metadata(*leader, &root_meta));
    }
    if (!rbt) {
        /* Due to optimization, the Red-black tree has not been created so far, so it will be
         * created additionally now. It may still not be worth creating a tree and it may be better
         * to insert the node by linear search instead, but that is a case for further optimization.
         */
        ret = lyds_additionally_create_rb_tree(first_sibling, leader, root_meta, &rbt);
        LY_CHECK_RET(ret);
    }

    /* Insert the node to the correct order. */
    ret = rb_insert(node, &rbt, &rbn);
    LY_CHECK_RET(ret);
    lyds_link_data_node(first_sibling, leader, node, root_meta, rbn);

    /* the root of the Red-black tree may changed due to insertion, so update the pointer to the root */
    RBT_SET(root_meta, rbt);

    return LY_SUCCESS;
}